

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

int __thiscall GGWave::maxBytesPerTx(GGWave *this,Protocols *protocols)

{
  int res;
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar1 = 1;
  for (lVar2 = 0xd; lVar2 != 0x16d; lVar2 = lVar2 + 0x10) {
    iVar3 = (int)*(char *)((long)protocols->data + lVar2 + -2);
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
    if (*(char *)((long)&protocols->data[0].name + lVar2) != '\0') {
      iVar1 = iVar3;
    }
  }
  return iVar1;
}

Assistant:

int GGWave::maxBytesPerTx(const Protocols & protocols) const {
    int res = 1;
    for (int i = 0; i < protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled == false) {
            continue;
        }
        res = GG_MAX(res, (int) protocol.bytesPerTx);
    }
    return res;
}